

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabFactory.H
# Opt level: O0

TagBox * __thiscall
amrex::DefaultFabFactory<amrex::TagBox>::create
          (DefaultFabFactory<amrex::TagBox> *this,Box *box,int ncomps,FabInfo *info,int param_5)

{
  TagBox *pTVar1;
  Arena *in_stack_ffffffffffffffb8;
  Box *in_stack_ffffffffffffffc8;
  TagBox *in_stack_ffffffffffffffd0;
  
  pTVar1 = (TagBox *)operator_new(0x48);
  TagBox::TagBox(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int)((ulong)pTVar1 >> 0x20),
                 SUB81((ulong)pTVar1 >> 0x18,0),SUB81((ulong)pTVar1 >> 0x10,0),
                 in_stack_ffffffffffffffb8);
  return pTVar1;
}

Assistant:

AMREX_NODISCARD
    virtual FAB* create (const Box& box, int ncomps, const FabInfo& info, int /*box_index*/) const override
    {
        return new FAB(box, ncomps, info.alloc, info.shared, info.arena);
    }